

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::end_scope(CompilerGLSL *this)

{
  CompilerError *this_00;
  allocator local_31;
  string local_30 [32];
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  local_10 = this;
  if (this->indent == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"Popping empty indent stack.",&local_31);
    CompilerError::CompilerError(this_00,(string *)local_30);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  this->indent = this->indent - 1;
  statement<char_const(&)[2]>(this,(char (*) [2])0x4dc908);
  return;
}

Assistant:

void CompilerGLSL::end_scope()
{
	if (!indent)
		SPIRV_CROSS_THROW("Popping empty indent stack.");
	indent--;
	statement("}");
}